

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode __thiscall JSONNode::as_array(JSONNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  long lVar3;
  jsonChildren *pjVar4;
  JSONNode **ppJVar5;
  size_t *psVar6;
  internalJSONNode *piVar7;
  long *in_RSI;
  JSONNode **ppJVar8;
  size_type __dnew;
  size_type local_50;
  json_string local_48;
  
  lVar3 = *in_RSI;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"no internal","");
  JSONDebug::_JSON_ASSERT(lVar3 != 0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_48.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_48.field_2._7_4_ = 0x6c616e72;
  local_48._M_string_length = 0xb;
  local_48.field_2._M_local_buf[0xb] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(*in_RSI != 0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  piVar7 = (internalJSONNode *)*in_RSI;
  if (piVar7->_type == '\x04') {
    piVar7->refcount = piVar7->refcount + 1;
    this->internal = piVar7;
    psVar6 = getCopyCtorCounter();
  }
  else {
    local_48.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_48.field_2._7_4_ = 0x6c616e72;
    local_48._M_string_length = 0xb;
    local_48.field_2._M_local_buf[0xb] = '\0';
    local_48._M_dataplus._M_p = (pointer)paVar1;
    JSONDebug::_JSON_ASSERT(true,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (*(char *)*in_RSI == '\x05') {
      duplicate(this);
      piVar7 = this->internal;
      piVar7->_type = '\x04';
      pjVar4 = piVar7->Children;
      local_50 = 0x16;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      local_48._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
      local_48.field_2._M_allocated_capacity._0_7_ = (undefined7)local_50;
      local_48.field_2._M_local_buf[7] = (char)(local_50 >> 0x38);
      builtin_strncpy(local_48._M_dataplus._M_p,"Children is null begin",0x16);
      local_48._M_string_length = local_50;
      local_48._M_dataplus._M_p[local_50] = '\0';
      JSONDebug::_JSON_ASSERT(true,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      ppJVar8 = pjVar4->array;
      pjVar4 = this->internal->Children;
      local_50 = 0x14;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      local_48._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
      local_48.field_2._M_allocated_capacity._0_7_ = (undefined7)local_50;
      local_48.field_2._M_local_buf[7] = (char)(local_50 >> 0x38);
      builtin_strncpy(local_48._M_dataplus._M_p,"Children is null end",0x14);
      local_48._M_string_length = local_50;
      local_48._M_dataplus._M_p[local_50] = '\0';
      JSONDebug::_JSON_ASSERT(true,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      uVar2 = pjVar4->mysize;
      ppJVar5 = pjVar4->array;
      for (; ppJVar8 != ppJVar5 + uVar2; ppJVar8 = ppJVar8 + 1) {
        clear_name(*ppJVar8);
      }
      return (JSONNode)(internalJSONNode *)this;
    }
    piVar7 = internalJSONNode::newInternal('\x04');
    this->internal = piVar7;
    local_50 = 0x16;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    local_48._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
    local_48.field_2._M_allocated_capacity._0_7_ = (undefined7)local_50;
    local_48.field_2._M_local_buf[7] = (char)(local_50 >> 0x38);
    builtin_strncpy(local_48._M_dataplus._M_p,"Not a proper JSON type",0x16);
    local_48._M_string_length = local_50;
    local_48._M_dataplus._M_p[local_50] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    psVar6 = getCtorCounter();
  }
  *psVar6 = *psVar6 + 1;
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_array(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_ARRAY){
		  return *this;
	   } else if (type() == JSON_NODE){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_ARRAY;
		  json_foreach(res.internal -> CHILDREN, runner){
			 (*runner) -> clear_name();
		  }
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_ARRAY);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_ARRAY);
    }